

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O3

long __thiscall gl4cts::anon_unknown_0::BasicSSOComputePipeline::Run(BasicSSOComputePipeline *this)

{
  CallLogWrapper *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  RenderTarget *pRVar2;
  bool bVar3;
  GLuint GVar4;
  bool *compile_error;
  bool *extraout_RDX;
  bool *extraout_RDX_00;
  bool *extraout_RDX_01;
  bool *extraout_RDX_02;
  bool *pbVar5;
  int h;
  vec4 *expected;
  long lVar6;
  string local_58;
  char *local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_30;
  
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,
             "\nlayout(local_size_x = 4) in;\nlayout(std430) buffer Output {\n  vec4 g_output[4];\n};\nvoid main() {\n  const vec2 quad[4] = { vec2(-1, -1), vec2(1, -1), vec2(-1, 1), vec2(1, 1) };\n  g_output[gl_GlobalInvocationID.x] = vec4(quad[gl_GlobalInvocationID.x], 0, 1);\n}"
             ,"");
  GVar4 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_58);
  this->m_csp = GVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    GVar4 = this->m_csp;
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glProgramParameteri(this_00,GVar4,0x8258,1);
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_csp);
  bVar3 = ComputeShaderBase::CheckProgram(&this->super_ComputeShaderBase,this->m_csp,compile_error);
  lVar6 = -1;
  if (bVar3) {
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,
               "\nlayout(location = 0) in vec4 i_position;\nout gl_PerVertex {\n  vec4 gl_Position;\n};\nvoid main() {\n  gl_Position = i_position;\n}"
               ,"");
    local_38 = "#version 430 core\n";
    local_30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_58._M_dataplus._M_p;
    GVar4 = glu::CallLogWrapper::glCreateShaderProgramv(this_00,0x8b31,2,&local_38);
    this->m_vsp = GVar4;
    pbVar5 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      GVar4 = this->m_vsp;
      pbVar5 = extraout_RDX_00;
    }
    bVar3 = ComputeShaderBase::CheckProgram(&this->super_ComputeShaderBase,GVar4,pbVar5);
    if (bVar3) {
      local_58._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,
                 "\nlayout(location = 0) out vec4 o_color;\nvoid main() {\n  o_color = vec4(0, 1, 0, 1);\n}"
                 ,"");
      local_38 = "#version 430 core\n";
      local_30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_58._M_dataplus._M_p;
      GVar4 = glu::CallLogWrapper::glCreateShaderProgramv(this_00,0x8b30,2,&local_38);
      this->m_fsp = GVar4;
      pbVar5 = extraout_RDX_01;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        GVar4 = this->m_fsp;
        pbVar5 = extraout_RDX_02;
      }
      bVar3 = ComputeShaderBase::CheckProgram(&this->super_ComputeShaderBase,GVar4,pbVar5);
      if (bVar3) {
        glu::CallLogWrapper::glGenProgramPipelines(this_00,1,&this->m_pipeline);
        glu::CallLogWrapper::glUseProgramStages(this_00,this->m_pipeline,1,this->m_vsp);
        glu::CallLogWrapper::glUseProgramStages(this_00,this->m_pipeline,2,this->m_fsp);
        glu::CallLogWrapper::glUseProgramStages(this_00,this->m_pipeline,0x20,this->m_csp);
        glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_storage_buffer);
        glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer);
        glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x40,(void *)0x0,0x88e8);
        glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
        glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vertex_array);
        glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_storage_buffer);
        h = 0;
        expected = (vec4 *)0x0;
        glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0,(void *)0x0);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
        glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
        glu::CallLogWrapper::glBindVertexArray(this_00,0);
        glu::CallLogWrapper::glBindProgramPipeline(this_00,this->m_pipeline);
        glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_storage_buffer);
        glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
        glu::CallLogWrapper::glClear(this_00,0x4000);
        glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
        glu::CallLogWrapper::glMemoryBarrier(this_00,1);
        glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
        pRVar2 = (this->super_ComputeShaderBase).renderTarget;
        local_58._M_dataplus._M_p = (pointer)0x3f80000000000000;
        local_58._M_string_length = 0x3f80000000000000;
        bVar3 = ComputeShaderBase::ValidateReadBuffer
                          (&this->super_ComputeShaderBase,pRVar2->m_width,pRVar2->m_height,
                           (int)&local_58,h,expected);
        lVar6 = (ulong)bVar3 - 1;
      }
    }
  }
  return lVar6;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(local_size_x = 4) in;" NL "layout(std430) buffer Output {" NL "  vec4 g_output[4];" NL "};" NL
			   "void main() {" NL "  const vec2 quad[4] = { vec2(-1, -1), vec2(1, -1), vec2(-1, 1), vec2(1, 1) };" NL
			   "  g_output[gl_GlobalInvocationID.x] = vec4(quad[gl_GlobalInvocationID.x], 0, 1);" NL "}";

		m_csp = CreateComputeProgram(glsl_cs);
		glProgramParameteri(m_csp, GL_PROGRAM_SEPARABLE, GL_TRUE);
		glLinkProgram(m_csp);
		if (!CheckProgram(m_csp))
			return ERROR;

		const char* const glsl_vs =
			NL "layout(location = 0) in vec4 i_position;" NL "out gl_PerVertex {" NL "  vec4 gl_Position;" NL "};" NL
			   "void main() {" NL "  gl_Position = i_position;" NL "}";
		m_vsp = BuildShaderProgram(GL_VERTEX_SHADER, glsl_vs);
		if (!CheckProgram(m_vsp))
			return ERROR;

		const char* const glsl_fs =
			NL "layout(location = 0) out vec4 o_color;" NL "void main() {" NL "  o_color = vec4(0, 1, 0, 1);" NL "}";
		m_fsp = BuildShaderProgram(GL_FRAGMENT_SHADER, glsl_fs);
		if (!CheckProgram(m_fsp))
			return ERROR;

		glGenProgramPipelines(1, &m_pipeline);
		glUseProgramStages(m_pipeline, GL_VERTEX_SHADER_BIT, m_vsp);
		glUseProgramStages(m_pipeline, GL_FRAGMENT_SHADER_BIT, m_fsp);
		glUseProgramStages(m_pipeline, GL_COMPUTE_SHADER_BIT, m_csp);

		glGenBuffers(1, &m_storage_buffer);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(vec4) * 4, NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glGenVertexArrays(1, &m_vertex_array);
		glBindVertexArray(m_vertex_array);
		glBindBuffer(GL_ARRAY_BUFFER, m_storage_buffer);
		glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, 0, 0);
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glEnableVertexAttribArray(0);
		glBindVertexArray(0);

		glBindProgramPipeline(m_pipeline);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glDispatchCompute(1, 1, 1);

		glClear(GL_COLOR_BUFFER_BIT);
		glBindVertexArray(m_vertex_array);
		glMemoryBarrier(GL_VERTEX_ATTRIB_ARRAY_BARRIER_BIT);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		if (!ValidateReadBuffer(0, 0, getWindowWidth(), getWindowHeight(), vec4(0, 1, 0, 1)))
			return ERROR;
		return NO_ERROR;
	}